

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor_extras.c
# Opt level: O0

int triggerize_fanouts(_glist *cnv)

{
  _gobj *p_Var1;
  int iVar2;
  t_object *obj_00;
  t_object *obj;
  t_gobj *next;
  t_gobj *ptStack_18;
  int count;
  t_gobj *gobj;
  _glist *cnv_local;
  
  next._4_4_ = 0;
  canvas_undo_add(cnv,UNDO_SEQUENCE_START,"triggerize",(void *)0x0);
  p_Var1 = cnv->gl_list;
  while (ptStack_18 = p_Var1, ptStack_18 != (t_gobj *)0x0) {
    p_Var1 = ptStack_18->g_next;
    obj_00 = g2o(ptStack_18);
    if (((obj_00 != (t_object *)0x0) && (iVar2 = glist_isselected(cnv,ptStack_18), iVar2 != 0)) &&
       (iVar2 = triggerize_fanout(cnv,obj_00), iVar2 != 0)) {
      next._4_4_ = next._4_4_ + 1;
    }
  }
  canvas_undo_add(cnv,UNDO_SEQUENCE_END,"triggerize",(void *)0x0);
  return next._4_4_;
}

Assistant:

static int triggerize_fanouts(t_glist*cnv)
{
        /* iterate over all selected objects and try to eliminate fanouts */
    t_gobj*gobj = NULL;
    int count=0;
    canvas_undo_add(cnv, UNDO_SEQUENCE_START, "triggerize", 0);
    for(gobj=cnv->gl_list; gobj; )
    {
        t_gobj*next=gobj->g_next;
        t_object*obj=g2o(gobj);
        if(obj && glist_isselected(cnv, gobj) && triggerize_fanout(cnv, obj))
            count++;
        gobj = next;
    }
    canvas_undo_add(cnv, UNDO_SEQUENCE_END, "triggerize", 0);
    return count;
}